

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O2

void evthread_debug_lock_mark_unlocked(uint mode,debug_lock *lock)

{
  int iVar1;
  unsigned_long uVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (lock->signature == 0xdeb0b10c) {
    if ((lock->locktype & 2) == 0) {
      if ((mode & 0xc) != 0) {
        pcVar4 = "(mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0";
        uVar3 = 0x111;
        goto LAB_001fb350;
      }
    }
    else if ((mode & 0xc) == 0) {
      pcVar4 = "mode & (EVTHREAD_READ|EVTHREAD_WRITE)";
      uVar3 = 0x10f;
      goto LAB_001fb350;
    }
    if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
      iVar1 = lock->count;
    }
    else {
      uVar2 = (*evthread_id_fn_)();
      if (lock->held_by != uVar2) {
        pcVar4 = "lock->held_by == me";
        uVar3 = 0x115;
        goto LAB_001fb350;
      }
      iVar1 = lock->count;
      if (iVar1 == 1) {
        lock->held_by = 0;
        lock->count = 0;
        return;
      }
    }
    lock->count = iVar1 + -1;
    if (0 < iVar1) {
      return;
    }
    pcVar4 = "lock->count >= 0";
    uVar3 = 0x11a;
  }
  else {
    pcVar4 = "DEBUG_LOCK_SIG == lock->signature";
    uVar3 = 0x10d;
  }
LAB_001fb350:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,uVar3,pcVar4,"evthread_debug_lock_mark_unlocked");
}

Assistant:

static void
evthread_debug_lock_mark_unlocked(unsigned mode, struct debug_lock *lock)
{
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	if (lock->locktype & EVTHREAD_LOCKTYPE_READWRITE)
		EVUTIL_ASSERT(mode & (EVTHREAD_READ|EVTHREAD_WRITE));
	else
		EVUTIL_ASSERT((mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0);
	if (evthread_id_fn_) {
		unsigned long me;
		me = evthread_id_fn_();
		EVUTIL_ASSERT(lock->held_by == me);
		if (lock->count == 1)
			lock->held_by = 0;
	}
	--lock->count;
	EVUTIL_ASSERT(lock->count >= 0);
}